

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ForkBranch<kj::_::Void>::get(ForkBranch<kj::_::Void> *this,ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<kj::_::Void> *pEVar1;
  Void local_29;
  Void *local_28;
  Void *value;
  ExceptionOr<kj::_::Void> *hubResult;
  ExceptionOrValue *output_local;
  ForkBranch<kj::_::Void> *this_local;
  
  hubResult = (ExceptionOr<kj::_::Void> *)output;
  output_local = (ExceptionOrValue *)this;
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  value = (Void *)ExceptionOrValue::as<kj::_::Void>(this_00);
  local_28 = readMaybe<kj::_::Void>(&((ExceptionOr<kj::_::Void> *)value)->value);
  if (local_28 == (Void *)0x0) {
    pEVar1 = ExceptionOrValue::as<kj::_::Void>(&hubResult->super_ExceptionOrValue);
    Maybe<kj::_::Void>::operator=(&pEVar1->value,(void *)0x0);
  }
  else {
    copyOrAddRef<kj::_::Void>(local_28);
    pEVar1 = ExceptionOrValue::as<kj::_::Void>(&hubResult->super_ExceptionOrValue);
    Maybe<kj::_::Void>::operator=(&pEVar1->value,&local_29);
  }
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)hubResult,(Maybe<kj::Exception> *)value);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,&hubResult->super_ExceptionOrValue);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }